

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall
Analyser_onePrimaryExternalVariable_Test::~Analyser_onePrimaryExternalVariable_Test
          (Analyser_onePrimaryExternalVariable_Test *this)

{
  Analyser_onePrimaryExternalVariable_Test *this_local;
  
  ~Analyser_onePrimaryExternalVariable_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Analyser, onePrimaryExternalVariable)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("generator/hodgkin_huxley_squid_axon_model_1952/model.cellml"));

    EXPECT_EQ(size_t(0), parser->issueCount());

    auto analyser = libcellml::Analyser::create();

    analyser->addExternalVariable(libcellml::AnalyserExternalVariable::create(model->component("membrane")->variable("V")));

    analyser->analyseModel(model);

    EXPECT_EQ(size_t(0), analyser->issueCount());
}